

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O0

void __thiscall xmrig::Client::startTimeout(Client *this)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  uint64_t uVar4;
  long in_RDI;
  uint64_t ms;
  undefined4 local_1c;
  Client *in_stack_fffffffffffffff0;
  
  *(undefined8 *)(in_RDI + 0x4ab8) = 0;
  bVar1 = has<(xmrig::IClient::Extension)2>(in_stack_fffffffffffffff0);
  if (bVar1) {
    iVar2 = Pool::keepAlive((Pool *)(in_RDI + 0x130));
    if (iVar2 < 1) {
      local_1c = 0x3c;
    }
    else {
      local_1c = Pool::keepAlive((Pool *)(in_RDI + 0x130));
    }
    lVar3 = (long)local_1c * 1000;
    uVar4 = Chrono::steadyMSecs();
    *(uint64_t *)(in_RDI + 0x4ac8) = uVar4 + lVar3;
  }
  return;
}

Assistant:

void xmrig::Client::startTimeout()
{
    m_expire = 0;

    if (has<EXT_KEEPALIVE>()) {
        const uint64_t ms = static_cast<uint64_t>(m_pool.keepAlive() > 0 ? m_pool.keepAlive() : Pool::kKeepAliveTimeout) * 1000;

        m_keepAlive = Chrono::steadyMSecs() + ms;
    }
}